

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalSubscriptMat3(ShaderEvalContext *c)

{
  Vector<float,_3> local_90;
  Vector<float,_3> local_80;
  tcu local_74 [12];
  Vector<float,_3> local_68;
  tcu local_5c [12];
  tcu local_50 [12];
  tcu local_44 [12];
  VecAccess<float,_4,_3> local_38;
  
  local_80.m_data._0_8_ = *(undefined8 *)(c->coords).m_data;
  local_68.m_data[0] = local_80.m_data[1];
  local_68.m_data._4_8_ = *(undefined8 *)((c->coords).m_data + 2);
  local_80.m_data[2] = local_68.m_data[1];
  tcu::operator*(local_5c,0.5,&local_68);
  tcu::operator+(local_50,&local_80,(Vector<float,_3> *)local_5c);
  local_90.m_data[2] = (c->coords).m_data[0];
  local_90.m_data._0_8_ = *(undefined8 *)((c->coords).m_data + 2);
  tcu::operator*(local_74,0.25,&local_90);
  tcu::operator+(local_44,(Vector<float,_3> *)local_50,(Vector<float,_3> *)local_74);
  local_38.m_vector = &c->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_44);
  return;
}

Assistant:

void evalSubscriptMat3		(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3) + 0.25f*c.coords.swizzle(2,3,0); }